

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O3

UINT GetTempFileNameW(LPCWSTR lpPathName,LPCWSTR lpPrefixString,UINT uUnique,LPWSTR lpTempFileName)

{
  SIZE_T *lpMultiByteStr;
  long lVar1;
  DWORD DVar2;
  UINT UVar3;
  int iVar4;
  void *pvVar5;
  size_t sVar6;
  LPCSTR lpTempFileName_00;
  int *piVar7;
  LPCSTR lpPrefixString_00;
  int iVar8;
  UINT UVar9;
  long in_FS_OFFSET;
  undefined1 local_b8 [8];
  PathCharString prefix_stringPS;
  PathCharString full_namePS;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lpMultiByteStr = &prefix_stringPS.m_count;
  prefix_stringPS._32_8_ = local_b8;
  prefix_stringPS.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0032c278;
  pvVar5 = pthread_getspecific(CorUnix::thObjKey);
  if (pvVar5 == (void *)0x0) {
    CreateCurrentThreadData();
  }
  iVar4 = 0x10b;
  if ((lpPathName == (LPCWSTR)0x0) || (*lpPathName == L'\0')) {
LAB_0032c229:
    piVar7 = __errno_location();
    *piVar7 = iVar4;
    UVar9 = 0;
  }
  else {
    sVar6 = PAL_wcslen(lpPathName);
    iVar8 = ((int)sVar6 + 1) * MaxWCharToAcpLengthFactor;
    StackString<32UL,_char>::Resize((StackString<32UL,_char> *)&prefix_stringPS.m_count,(long)iVar8)
    ;
    iVar4 = 8;
    if (lpMultiByteStr == (SIZE_T *)0x0) goto LAB_0032c229;
    iVar8 = WideCharToMultiByte(0,0,lpPathName,-1,(LPSTR)lpMultiByteStr,iVar8,(LPCSTR)0x0,
                                (LPBOOL)0x0);
    prefix_stringPS.m_count._0_1_ = 0;
    if (iVar8 == 0) {
      DVar2 = GetLastError();
      if (DVar2 == 0x7a) {
LAB_0032c108:
        iVar4 = 0xce;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032c278;
      }
      else {
        fprintf(_stderr,"] %s %s:%d","GetTempFileNameW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0xe81);
        iVar4 = 0x54f;
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar2);
      }
      goto LAB_0032c229;
    }
    if (lpPrefixString != (LPCWSTR)0x0) {
      sVar6 = PAL_wcslen(lpPrefixString);
      StackString<32UL,_char>::Resize
                ((StackString<32UL,_char> *)local_b8,
                 (long)(((int)sVar6 + 1) * MaxWCharToAcpLengthFactor));
      lpPrefixString_00 = (LPCSTR)prefix_stringPS._32_8_;
      if (prefix_stringPS._32_8_ != 0) {
        iVar8 = WideCharToMultiByte(0,0,lpPrefixString,-1,(LPSTR)prefix_stringPS._32_8_,
                                    0x3f8 - iVar8,(LPCSTR)0x0,(LPBOOL)0x0);
        if ((ulong)(long)iVar8 < prefix_stringPS.m_size) {
          prefix_stringPS.m_size = (long)iVar8;
        }
        *(undefined1 *)(prefix_stringPS._32_8_ + prefix_stringPS.m_size) = 0;
        if (iVar8 != 0) goto LAB_0032c125;
        DVar2 = GetLastError();
        if (DVar2 == 0x7a) goto LAB_0032c108;
        fprintf(_stderr,"] %s %s:%d","GetTempFileNameW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0xea2);
        iVar4 = 0x54f;
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar2);
      }
      goto LAB_0032c229;
    }
    lpPrefixString_00 = (LPCSTR)0x0;
LAB_0032c125:
    lpTempFileName_00 = (LPCSTR)CorUnix::InternalMalloc(0x400);
    if (lpTempFileName_00 == (LPCSTR)0x0) goto LAB_0032c229;
    UVar3 = GetTempFileNameA((LPCSTR)lpMultiByteStr,lpPrefixString_00,0,lpTempFileName_00);
    UVar9 = 0;
    if (UVar3 != 0) {
      iVar4 = MultiByteToWideChar(0,0,lpTempFileName_00,-1,lpTempFileName,0x400);
      CorUnix::InternalFree(lpTempFileName_00);
      UVar9 = UVar3;
      if (iVar4 == 0) {
        DVar2 = GetLastError();
        if (DVar2 == 0x7a) goto LAB_0032c108;
        fprintf(_stderr,"] %s %s:%d","GetTempFileNameW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0xec6);
        iVar4 = 0x54f;
        fprintf(_stderr,"MultiByteToWideChar failure! error is %d",(ulong)DVar2);
        goto LAB_0032c229;
      }
    }
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_b8);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&prefix_stringPS.m_count);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return UVar9;
    }
    __stack_chk_fail();
  }
LAB_0032c278:
  abort();
}

Assistant:

UINT
PALAPI
GetTempFileNameW(
         IN LPCWSTR lpPathName,
         IN LPCWSTR lpPrefixString,
         IN UINT uUnique,
         OUT LPWSTR lpTempFileName)
{
    CPalThread *pThread;
    INT path_size = 0;
    INT prefix_size = 0;
    CHAR * full_name;
    CHAR * prefix_string;
    CHAR * tempfile_name;
    PathCharString full_namePS, prefix_stringPS;
    INT length = 0;
    UINT   uRet;

    PERF_ENTRY(GetTempFileNameW);
    ENTRY("GetTempFileNameW(lpPathName=%p (%S), lpPrefixString=%p (%S), uUnique=%u, "
          "lpTempFileName=%p)\n", lpPathName?lpPathName:W16_NULLSTRING, lpPathName?lpPathName:W16_NULLSTRING,
          lpPrefixString?lpPrefixString:W16_NULLSTRING,
          lpPrefixString?lpPrefixString:W16_NULLSTRING,uUnique, lpTempFileName);

    pThread = InternalGetCurrentThread();
    /* Sanity checks. */
    if ( !lpPathName || *lpPathName == '\0' )
    {
        pThread->SetLastError( ERROR_DIRECTORY );
        uRet = 0;
        goto done;
    }

    length = (PAL_wcslen(lpPathName)+1) * MaxWCharToAcpLengthFactor;
    full_name = full_namePS.OpenStringBuffer(length);
    if (NULL == full_name)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        uRet = 0;
        goto done;
    }
    path_size = WideCharToMultiByte( CP_ACP, 0, lpPathName, -1, full_name,
                                     length, NULL, NULL );
    full_namePS.CloseBuffer(path_size);
                                     
    if( path_size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpPathName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        }
        uRet = 0;
        goto done;
    }
    
    if (lpPrefixString != NULL) 
    {
        length = (PAL_wcslen(lpPrefixString)+1) * MaxWCharToAcpLengthFactor;
        prefix_string = prefix_stringPS.OpenStringBuffer(length);
        if (NULL == prefix_string)
        {
            pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            uRet = 0;
            goto done;
        }
        prefix_size = WideCharToMultiByte( CP_ACP, 0, lpPrefixString, -1, 
                                           prefix_string,
                                           MAX_LONGPATH - path_size - MAX_SEEDSIZE, 
                                           NULL, NULL );
        prefix_stringPS.CloseBuffer(prefix_size);
        
        if( prefix_size == 0 )
        {
            DWORD dwLastError = GetLastError();
            if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
            {
                WARN("Full name would be larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
                pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
            }
            else
            {
                ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
                pThread->SetLastError(ERROR_INTERNAL_ERROR);
            }
            uRet = 0;
            goto done;
        }
    }
    
    tempfile_name = (char*)InternalMalloc(MAX_LONGPATH);
    if (tempfile_name == NULL)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        uRet = 0;
        goto done;
    }
    
    uRet = GetTempFileNameA(full_name, 
                            (lpPrefixString == NULL) ? NULL : prefix_string,
                            0, tempfile_name);
    if (uRet)
    {                    
        path_size = MultiByteToWideChar( CP_ACP, 0, tempfile_name, -1, 
                                           lpTempFileName, MAX_LONGPATH );

        InternalFree(tempfile_name);
        tempfile_name = NULL;
        if (!path_size)
        {
            DWORD dwLastError = GetLastError();
            if (dwLastError == ERROR_INSUFFICIENT_BUFFER)
            {
                WARN("File names larger than MAX_PATH_FNAME (%d)! \n", MAX_LONGPATH);
                dwLastError = ERROR_FILENAME_EXCED_RANGE;
            }
            else
            {
                ASSERT("MultiByteToWideChar failure! error is %d", dwLastError);     
                dwLastError = ERROR_INTERNAL_ERROR;
            }
            pThread->SetLastError(dwLastError);
            uRet = 0;
        }
    }

done:
    LOGEXIT("GetTempFileNameW returns UINT %u\n", uRet);
    PERF_EXIT(GetTempFileNameW);
    return uRet;
}